

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.h
# Opt level: O0

uint32_t absl::lts_20240722::gbswap_32(uint32_t host_int)

{
  uint32_t host_int_local;
  
  return host_int >> 0x18 | (host_int & 0xff0000) >> 8 | (host_int & 0xff00) << 8 | host_int << 0x18
  ;
}

Assistant:

inline uint32_t gbswap_32(uint32_t host_int) {
#if ABSL_HAVE_BUILTIN(__builtin_bswap32) || defined(__GNUC__)
  return __builtin_bswap32(host_int);
#elif defined(_MSC_VER)
  return _byteswap_ulong(host_int);
#else
  return (((host_int & uint32_t{0xFF}) << 24) |
          ((host_int & uint32_t{0xFF00}) << 8) |
          ((host_int & uint32_t{0xFF0000}) >> 8) |
          ((host_int & uint32_t{0xFF000000}) >> 24));
#endif
}